

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

void __thiscall crnlib::dxt_image::flip_col(dxt_image *this,uint x)

{
  dxt3_block *this_00;
  uint8 uVar1;
  uint8 uVar2;
  element_type eVar3;
  char cVar4;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [14];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [13];
  undefined1 auVar31 [14];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  uint6 uVar34;
  uint uVar35;
  uint value;
  uint value_00;
  ulong uVar36;
  long lVar37;
  uint bit_ofs;
  int iVar38;
  uint x_1;
  uint x_00;
  byte bVar39;
  undefined4 in_register_00000034;
  undefined8 uVar40;
  byte bVar41;
  int iVar42;
  int iVar43;
  uint y;
  uint y_00;
  uint uVar44;
  ulong uVar45;
  short sVar46;
  uint uVar54;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [12];
  ushort uVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  element tmp [2];
  dxt3_block local_78 [3];
  int local_60;
  int local_5c;
  long local_58;
  undefined8 local_50;
  ulong local_48;
  dxt_image *local_40;
  ulong local_38;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined4 uVar47;
  undefined6 uVar48;
  undefined1 auVar49 [12];
  undefined1 auVar50 [14];
  undefined1 auVar53 [16];
  undefined1 auVar56 [14];
  undefined1 auVar59 [16];
  
  uVar40 = CONCAT44(in_register_00000034,x);
  if (this->m_blocks_y != 0) {
    iVar42 = ~x + this->m_blocks_x;
    local_48 = 0;
    local_40 = this;
    local_60 = iVar42;
    local_50 = uVar40;
    auVar64 = _DAT_001bae90;
    auVar65 = _DAT_001b4750;
    do {
      uVar36 = (ulong)this->m_num_elements_per_block;
      if (this->m_num_elements_per_block != 0) {
        local_38 = 0;
        do {
          iVar38 = this->m_blocks_x * (int)local_48;
          local_78[0].m_alpha =
               *&this->m_pElements[(uint)(((int)uVar40 + iVar38) * (int)uVar36 + (int)local_38)].
                 m_bytes;
          local_78[1].m_alpha =
               (uint8  [8])
               *(undefined8 *)
                this->m_pElements[(uint)((iVar38 + iVar42) * (int)uVar36 + (int)local_38)].m_bytes;
          lVar37 = 0;
          do {
            eVar3 = this->m_element_type[local_38];
            local_58 = lVar37;
            if (eVar3 == cAlphaDXT5) {
              iVar38 = 9;
              iVar43 = 0;
              iVar42 = 0;
              do {
                local_5c = iVar42;
                iVar42 = 0;
                do {
                  uVar45 = (ulong)((uint)(iVar43 + iVar42) >> 3);
                  uVar1 = local_78[lVar37].m_alpha[uVar45 + 2];
                  uVar2 = local_78[lVar37].m_alpha[uVar45 + 3];
                  bVar39 = (byte)(iVar43 + iVar42) & 7;
                  uVar35 = iVar38 + iVar42;
                  uVar36 = (ulong)(uVar35 >> 3);
                  uVar44 = (uint)local_78[lVar37].m_alpha[uVar36 + 2];
                  if (uVar35 < 0x28) {
                    uVar44 = (uint)CONCAT11(local_78[lVar37].m_alpha[uVar36 + 3],
                                            local_78[lVar37].m_alpha[uVar36 + 2]);
                  }
                  bVar41 = (byte)uVar35 & 7;
                  *(ushort *)(local_78[lVar37].m_alpha + uVar45 + 2) =
                       (ushort)((uVar44 >> bVar41 & 7) << bVar39) |
                       ~(ushort)(7 << bVar39) & CONCAT11(local_78[lVar37].m_alpha[uVar45 + 3],uVar1)
                  ;
                  uVar44 = (uint)local_78[lVar37].m_alpha[uVar36 + 2];
                  if (uVar35 < 0x28) {
                    uVar44 = (uint)CONCAT11(local_78[lVar37].m_alpha[uVar36 + 3],
                                            local_78[lVar37].m_alpha[uVar36 + 2]);
                  }
                  uVar44 = ((ushort)(CONCAT11(uVar2,uVar1) >> bVar39) & 7) << bVar41 |
                           ~(7 << bVar41) & uVar44;
                  local_78[lVar37].m_alpha[uVar36 + 2] = (uint8)uVar44;
                  if (uVar35 < 0x28) {
                    local_78[lVar37].m_alpha[uVar36 + 3] = (uint8)(uVar44 >> 8);
                  }
                  iVar42 = iVar42 + 0xc;
                } while (iVar42 != 0x30);
                iVar42 = local_5c + 1;
                iVar38 = iVar38 + -3;
                iVar43 = iVar43 + 3;
              } while (iVar42 != 2);
            }
            else if (eVar3 == cAlphaDXT3) {
              this_00 = local_78 + lVar37;
              x_00 = 0;
              do {
                y_00 = 0;
                do {
                  value = dxt3_block::get_alpha(this_00,x_00,y_00,false);
                  value_00 = dxt3_block::get_alpha(this_00,3 - x_00,y_00,false);
                  dxt3_block::set_alpha(this_00,x_00,y_00,value_00,false);
                  dxt3_block::set_alpha(this_00,3 - x_00,y_00,value,false);
                  y_00 = y_00 + 1;
                } while (y_00 != 4);
                x_00 = x_00 + 1;
                auVar64 = _DAT_001bae90;
                auVar65 = _DAT_001b4750;
              } while (x_00 != 2);
            }
            else if (eVar3 == cColorDXT1) {
              auVar51 = ZEXT416(*(uint *)(local_78[lVar37].m_alpha + 4));
              uVar35 = 6;
              uVar36 = 0;
              do {
                bVar39 = ~(byte)(3 << ((byte)uVar35 & 0x1f));
                bVar41 = ~(byte)(3 << ((byte)uVar36 & 0x1f));
                auVar62 = pshuflw(in_XMM2,ZEXT216(CONCAT11(bVar41,bVar41)),0);
                auVar20[0xd] = 0;
                auVar20._0_13_ = auVar51._0_13_;
                auVar20[0xe] = auVar51[7];
                auVar22[0xc] = auVar51[6];
                auVar22._0_12_ = auVar51._0_12_;
                auVar22._13_2_ = auVar20._13_2_;
                auVar23[0xb] = 0;
                auVar23._0_11_ = auVar51._0_11_;
                auVar23._12_3_ = auVar22._12_3_;
                auVar24[10] = auVar51[5];
                auVar24._0_10_ = auVar51._0_10_;
                auVar24._11_4_ = auVar23._11_4_;
                auVar25[9] = 0;
                auVar25._0_9_ = auVar51._0_9_;
                auVar25._10_5_ = auVar24._10_5_;
                auVar26[8] = auVar51[4];
                auVar26._0_8_ = auVar51._0_8_;
                auVar26._9_6_ = auVar25._9_6_;
                auVar27._7_8_ = 0;
                auVar27._0_7_ = auVar26._8_7_;
                Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),auVar51[3]);
                auVar32._9_6_ = 0;
                auVar32._0_9_ = Var28;
                auVar29._1_10_ = SUB1510(auVar32 << 0x30,5);
                auVar29[0] = auVar51[2];
                auVar33._11_4_ = 0;
                auVar33._0_11_ = auVar29;
                auVar30._1_12_ = SUB1512(auVar33 << 0x20,3);
                auVar30[0] = auVar51[1];
                uVar61 = (ushort)Var28;
                auVar21._10_2_ = 0;
                auVar21._0_10_ = auVar30._0_10_ << 0x10;
                auVar21._12_2_ = uVar61;
                uVar34 = CONCAT42(auVar21._10_4_,auVar29._0_2_);
                auVar31._6_8_ = 0;
                auVar31._0_6_ = uVar34;
                in_XMM2 = auVar62 & auVar51;
                auVar62._1_3_ = 0;
                auVar62[0] = auVar51[0] >> uVar36;
                uVar44 = (uint)CONCAT82(SUB148(auVar31 << 0x40,6),auVar30._0_2_);
                auVar62._4_4_ = uVar44 >> uVar36;
                uVar54 = (uint)uVar34;
                auVar62._8_4_ = uVar54 >> uVar36;
                auVar62._12_2_ = uVar61 >> uVar36;
                auVar62._14_2_ = 0;
                auVar52 = ZEXT216(CONCAT11(bVar39,bVar39));
                uVar45 = (ulong)uVar35;
                auVar57._1_3_ = 0;
                auVar57[0] = auVar51[0] >> uVar45;
                auVar57._4_4_ = uVar44 >> uVar45;
                auVar57._8_4_ = uVar54 >> uVar45;
                auVar57._12_2_ = uVar61 >> uVar45;
                auVar57._14_2_ = 0;
                auVar63 = pshuflw(auVar52,auVar52,0);
                auVar57 = auVar57 & auVar64;
                auVar58._0_4_ = auVar57._0_4_ << (int)uVar36;
                auVar58._4_4_ = auVar57._4_4_;
                auVar58._8_4_ = auVar57._8_4_;
                auVar58._12_4_ = auVar57._12_4_;
                auVar62 = auVar62 & auVar64;
                auVar58 = auVar58 & auVar65;
                sVar12 = auVar58._0_2_;
                cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar58[0] - (0xff < sVar12);
                sVar13 = auVar58._2_2_;
                sVar46 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar58[2] - (0xff < sVar13),
                                  cVar4);
                sVar14 = auVar58._4_2_;
                cVar5 = (0 < sVar14) * (sVar14 < 0x100) * auVar58[4] - (0xff < sVar14);
                sVar15 = auVar58._6_2_;
                uVar47 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar58[6] - (0xff < sVar15),
                                  CONCAT12(cVar5,sVar46));
                sVar16 = auVar58._8_2_;
                cVar6 = (0 < sVar16) * (sVar16 < 0x100) * auVar58[8] - (0xff < sVar16);
                sVar17 = auVar58._10_2_;
                uVar48 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar58[10] - (0xff < sVar17),
                                  CONCAT14(cVar6,uVar47));
                sVar18 = auVar58._12_2_;
                cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar58[0xc] - (0xff < sVar18);
                sVar19 = auVar58._14_2_;
                uVar40 = CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar58[0xe] - (0xff < sVar19),
                                  CONCAT16(cVar7,uVar48));
                cVar8 = (0 < sVar12) * (sVar12 < 0x100) * auVar58[0] - (0xff < sVar12);
                auVar55._0_10_ =
                     CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar58[2] - (0xff < sVar13),
                              CONCAT18(cVar8,uVar40));
                cVar9 = (0 < sVar14) * (sVar14 < 0x100) * auVar58[4] - (0xff < sVar14);
                auVar55[10] = cVar9;
                auVar55[0xb] = (0 < sVar15) * (sVar15 < 0x100) * auVar58[6] - (0xff < sVar15);
                cVar10 = (0 < sVar16) * (sVar16 < 0x100) * auVar58[8] - (0xff < sVar16);
                auVar56[0xc] = cVar10;
                auVar56._0_12_ = auVar55;
                auVar56[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar58[10] - (0xff < sVar17);
                cVar11 = (0 < sVar18) * (sVar18 < 0x100) * auVar58[0xc] - (0xff < sVar18);
                auVar59[0xe] = cVar11;
                auVar59._0_14_ = auVar56;
                auVar59[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar58[0xe] - (0xff < sVar19);
                sVar12 = (short)((uint)uVar47 >> 0x10);
                auVar60[1] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                auVar60[0] = (0 < sVar46) * (sVar46 < 0x100) * cVar4 - (0xff < sVar46);
                sVar13 = (short)((uint6)uVar48 >> 0x20);
                auVar60[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                sVar14 = (short)((ulong)uVar40 >> 0x30);
                auVar60[3] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                sVar15 = (short)((unkuint10)auVar55._0_10_ >> 0x40);
                auVar60[4] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                sVar16 = auVar55._10_2_;
                auVar60[5] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                sVar17 = auVar56._12_2_;
                auVar60[6] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                sVar18 = auVar59._14_2_;
                auVar60[7] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
                auVar60[8] = (0 < sVar46) * (sVar46 < 0x100) * cVar4 - (0xff < sVar46);
                auVar60[9] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                auVar60[10] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                auVar60[0xb] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                auVar60[0xc] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                auVar60[0xd] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                auVar60[0xe] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                auVar60[0xf] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
                auVar52._0_4_ = auVar62._0_4_ << uVar35;
                auVar52._4_4_ = auVar62._4_4_;
                auVar52._8_4_ = auVar62._8_4_;
                auVar52._12_4_ = auVar62._12_4_;
                auVar52 = auVar52 & auVar65;
                sVar12 = auVar52._0_2_;
                cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar52[0] - (0xff < sVar12);
                sVar13 = auVar52._2_2_;
                sVar46 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar52[2] - (0xff < sVar13),
                                  cVar4);
                sVar14 = auVar52._4_2_;
                cVar5 = (0 < sVar14) * (sVar14 < 0x100) * auVar52[4] - (0xff < sVar14);
                sVar15 = auVar52._6_2_;
                uVar47 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar52[6] - (0xff < sVar15),
                                  CONCAT12(cVar5,sVar46));
                sVar16 = auVar52._8_2_;
                cVar6 = (0 < sVar16) * (sVar16 < 0x100) * auVar52[8] - (0xff < sVar16);
                sVar17 = auVar52._10_2_;
                uVar48 = CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar52[10] - (0xff < sVar17),
                                  CONCAT14(cVar6,uVar47));
                sVar18 = auVar52._12_2_;
                cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar52[0xc] - (0xff < sVar18);
                sVar19 = auVar52._14_2_;
                uVar40 = CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar52[0xe] - (0xff < sVar19),
                                  CONCAT16(cVar7,uVar48));
                cVar8 = (0 < sVar12) * (sVar12 < 0x100) * auVar52[0] - (0xff < sVar12);
                auVar49._0_10_ =
                     CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar52[2] - (0xff < sVar13),
                              CONCAT18(cVar8,uVar40));
                cVar9 = (0 < sVar14) * (sVar14 < 0x100) * auVar52[4] - (0xff < sVar14);
                auVar49[10] = cVar9;
                auVar49[0xb] = (0 < sVar15) * (sVar15 < 0x100) * auVar52[6] - (0xff < sVar15);
                cVar10 = (0 < sVar16) * (sVar16 < 0x100) * auVar52[8] - (0xff < sVar16);
                auVar50[0xc] = cVar10;
                auVar50._0_12_ = auVar49;
                auVar50[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar52[10] - (0xff < sVar17);
                cVar11 = (0 < sVar18) * (sVar18 < 0x100) * auVar52[0xc] - (0xff < sVar18);
                auVar53[0xe] = cVar11;
                auVar53._0_14_ = auVar50;
                auVar53[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar52[0xe] - (0xff < sVar19);
                sVar12 = (short)((uint)uVar47 >> 0x10);
                auVar51[1] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                auVar51[0] = (0 < sVar46) * (sVar46 < 0x100) * cVar4 - (0xff < sVar46);
                sVar13 = (short)((uint6)uVar48 >> 0x20);
                auVar51[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                sVar14 = (short)((ulong)uVar40 >> 0x30);
                auVar51[3] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                sVar15 = (short)((unkuint10)auVar49._0_10_ >> 0x40);
                auVar51[4] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                sVar16 = auVar49._10_2_;
                auVar51[5] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                sVar17 = auVar50._12_2_;
                auVar51[6] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                sVar18 = auVar53._14_2_;
                auVar51[7] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
                auVar51[8] = (0 < sVar46) * (sVar46 < 0x100) * cVar4 - (0xff < sVar46);
                auVar51[9] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
                auVar51[10] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
                auVar51[0xb] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
                auVar51[0xc] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
                auVar51[0xd] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
                auVar51[0xe] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
                auVar51[0xf] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
                auVar51 = auVar51 | (auVar60 | in_XMM2) & auVar63;
                uVar35 = uVar35 - 2;
                uVar36 = (ulong)((int)uVar36 + 2);
              } while (uVar35 != 2);
              *(int *)(local_78[lVar37].m_alpha + 4) = auVar51._0_4_;
            }
            lVar37 = local_58 + 1;
            this = local_40;
          } while (local_58 == 0);
          *&local_40->m_pElements
            [(local_40->m_blocks_x * (int)local_48 + (int)local_50) *
             local_40->m_num_elements_per_block + (int)local_38].m_bytes = local_78[1].m_alpha;
          *&local_40->m_pElements
            [(local_40->m_blocks_x * (int)local_48 + local_60) * local_40->m_num_elements_per_block
             + (int)local_38].m_bytes = local_78[0].m_alpha;
          local_38 = local_38 + 1;
          uVar36 = (ulong)local_40->m_num_elements_per_block;
          uVar40 = local_50;
          iVar42 = local_60;
        } while (local_38 < uVar36);
      }
      uVar35 = (int)local_48 + 1;
      local_48 = (ulong)uVar35;
    } while (uVar35 < this->m_blocks_y);
  }
  return;
}

Assistant:

void dxt_image::flip_col(uint x) {
  const uint other_x = (m_blocks_x - 1) - x;
  for (uint y = 0; y < m_blocks_y; y++) {
    for (uint e = 0; e < get_elements_per_block(); e++) {
      element tmp[2] = {get_element(x, y, e), get_element(other_x, y, e)};

      for (uint i = 0; i < 2; i++) {
        switch (get_element_type(e)) {
          case cColorDXT1:
            reinterpret_cast<dxt1_block*>(&tmp[i])->flip_x();
            break;
          case cAlphaDXT3:
            reinterpret_cast<dxt3_block*>(&tmp[i])->flip_x();
            break;
          case cAlphaDXT5:
            reinterpret_cast<dxt5_block*>(&tmp[i])->flip_x();
            break;
          default:
            CRNLIB_ASSERT(0);
            break;
        }
      }

      get_element(x, y, e) = tmp[1];
      get_element(other_x, y, e) = tmp[0];
    }
  }
}